

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall amrex::AmrLevel::AmrLevel(AmrLevel *this)

{
  undefined8 *in_RDI;
  Geometry *in_stack_ffffffffffffffe0;
  BoxArray *this_00;
  BoxArray *local_18;
  
  *in_RDI = &PTR__AmrLevel_01803af0;
  Geometry::Geometry(in_stack_ffffffffffffffe0);
  BoxArray::BoxArray((BoxArray *)in_stack_ffffffffffffffe0);
  DistributionMapping::DistributionMapping((DistributionMapping *)0x10f4eea);
  IntVect::IntVect((IntVect *)(in_RDI + 0x2b));
  IntVect::IntVect((IntVect *)((long)in_RDI + 0x164));
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::Vector
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)0x10f4f1f);
  BoxArray::BoxArray((BoxArray *)in_stack_ffffffffffffffe0);
  Box::Box((Box *)in_stack_ffffffffffffffe0);
  std::
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,std::default_delete<amrex::FabFactory<amrex::FArrayBox>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::FArrayBox>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              *)in_stack_ffffffffffffffe0);
  local_18 = (BoxArray *)(in_RDI + 0x44);
  this_00 = (BoxArray *)(in_RDI + 0x6b);
  do {
    BoxArray::BoxArray(this_00);
    local_18 = local_18 + 1;
  } while (local_18 != this_00);
  BoxArray::BoxArray(this_00);
  in_RDI[0x2a] = 0;
  *(undefined4 *)(in_RDI + 1) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x42) = 0;
  return;
}

Assistant:

AmrLevel::AmrLevel () noexcept
{

   BL_PROFILE("AmrLevel::AmrLevel()");
   parent = 0;
   level = -1;
   levelDirectoryCreated = false;
}